

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::FunctionBody*>
          (BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,FunctionBody **key,int *i,int *last,uint *targetBucket)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int *piVar6;
  hash_t extraout_EDX;
  hash_t otherHashCode;
  hash_t extraout_EDX_00;
  
  lVar2 = *(long *)this;
  if (lVar2 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                         *)this,(uint)((ulong)*key >> 3) | 1);
    *targetBucket = uVar5;
    *last = -1;
    lVar3 = *(long *)(this + 8);
    piVar6 = (int *)(lVar2 + (ulong)*targetBucket * 4);
    uVar5 = 0;
    otherHashCode = extraout_EDX;
    while( true ) {
      iVar1 = *piVar6;
      *i = iVar1;
      if ((long)iVar1 < 0) break;
      bVar4 = DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::WriteBarrierPtr<Js::FunctionBody>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ::KeyEquals<DefaultComparer<Js::FunctionBody*>,Js::FunctionBody*>
                        ((DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,Memory::WriteBarrierPtr<Js::FunctionBody>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          *)((long)iVar1 * 0x10 + lVar3),key,otherHashCode);
      if (bVar4) {
        if (*(DictionaryStats **)(this + 0x30) == (DictionaryStats *)0x0) {
          return true;
        }
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar5);
        return true;
      }
      uVar5 = uVar5 + 1;
      iVar1 = *i;
      *last = iVar1;
      piVar6 = (int *)((long)iVar1 * 0x10 + lVar3 + 8);
      otherHashCode = extraout_EDX_00;
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar5);
  }
  return false;
}

Assistant:

inline bool FindEntryWithKey(const LookupType& key, int *const i, int *const last, uint *const targetBucket)
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                *targetBucket = this->GetBucket(hashCode);
                *last = -1;
                EntryType * localEntries = entries;
                for (*i = localBuckets[*targetBucket]; *i >= 0; *last = *i, *i = localEntries[*i].next)
                {
                    if (localEntries[*i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return true;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }
#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return false;
        }